

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O1

bool __thiscall
gss::innards::HomomorphismSearcher::propagate_occur_less_thans
          (HomomorphismSearcher *this,
          optional<gss::innards::HomomorphismAssignment> *current_assignment,
          HomomorphismAssignments *assignments,Domains *new_domains)

{
  uint *puVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  pointer ppVar5;
  pointer pHVar6;
  pointer pHVar7;
  pointer pHVar8;
  pointer pHVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  HomomorphismDomain *d_1;
  pointer poVar14;
  SVOBitset *pSVar15;
  ulong uVar16;
  pointer poVar17;
  pointer pHVar18;
  type *a;
  pointer ppVar19;
  long lVar20;
  pointer pHVar21;
  uint uVar22;
  uint uVar23;
  SVOBitset *pSVar24;
  byte bVar25;
  byte bVar26;
  uint uVar27;
  uint uVar28;
  type *a_2;
  pointer ppVar29;
  bool bVar30;
  bool bVar31;
  Domains *__range3;
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  occurs;
  anon_class_24_3_9ba074a0 build_occurs;
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  local_60;
  anon_class_24_3_9ba074a0 local_48;
  
  std::
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  ::vector(&local_60,(ulong)this->model->target_size,(allocator_type *)&local_48);
  ppVar19 = (this->model->target_occur_less_thans_in_convenient_order).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->model->target_occur_less_thans_in_convenient_order).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48.occurs = &local_60;
  local_48.this = this;
  local_48.new_domains = new_domains;
  if (ppVar19 != ppVar5) {
    do {
      propagate_occur_less_thans::anon_class_24_3_9ba074a0::operator()(&local_48,ppVar19->first);
      propagate_occur_less_thans::anon_class_24_3_9ba074a0::operator()(&local_48,ppVar19->second);
      ppVar19 = ppVar19 + 1;
    } while (ppVar19 != ppVar5);
  }
  poVar17 = local_60.
            super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pHVar7 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pHVar6 = (assignments->values).
           super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pHVar18 = pHVar6; pHVar18 != pHVar7; pHVar18 = pHVar18 + 1) {
    uVar13 = (pHVar18->assignment).target_vertex;
    if (local_60.
        super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar13].
        super__Optional_base<gss::innards::SVOBitset,_false,_false>._M_payload.
        super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
        super__Optional_payload_base<gss::innards::SVOBitset>._M_engaged == true) {
      poVar14 = local_60.
                super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar13;
      if (0x10 < (poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
                 super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                 super__Optional_payload_base<gss::innards::SVOBitset>._M_payload._M_value.n_words)
      {
        poVar14 = *(pointer *)
                   &(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>).
                    _M_payload.super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                    super__Optional_payload_base<gss::innards::SVOBitset>._M_payload;
      }
      uVar13 = (pHVar18->assignment).pattern_vertex;
      uVar22 = uVar13 + 0x3f;
      if (-1 < (int)uVar13) {
        uVar22 = uVar13;
      }
      puVar2 = (ulong *)((long)&(poVar14->
                                super__Optional_base<gss::innards::SVOBitset,_false,_false>).
                                _M_payload.
                                super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>
                                .super__Optional_payload_base<gss::innards::SVOBitset>._M_payload +
                        (long)((int)uVar22 >> 6) * 8);
      *puVar2 = *puVar2 | 1L << ((ulong)uVar13 & 0x3f);
    }
  }
  ppVar19 = (this->model->target_occur_less_thans_in_convenient_order).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->model->target_occur_less_thans_in_convenient_order).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar19 != ppVar5) {
    pHVar8 = (new_domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pHVar9 = (new_domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    ppVar29 = ppVar19;
    do {
      uVar13 = ppVar29->first;
      uVar16 = (ulong)poVar17[uVar13].super__Optional_base<gss::innards::SVOBitset,_false,_false>.
                      _M_payload.
                      super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                      super__Optional_payload_base<gss::innards::SVOBitset>._M_payload._M_value.
                      n_words;
      if (uVar16 < 0x11) {
        poVar14 = poVar17 + uVar13;
      }
      else {
        poVar14 = *(pointer *)
                   &poVar17[uVar13].super__Optional_base<gss::innards::SVOBitset,_false,_false>.
                    _M_payload.super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                    super__Optional_payload_base<gss::innards::SVOBitset>._M_payload;
      }
      uVar13 = 0xffffffff;
      if (uVar16 != 0) {
        lVar20 = 0;
LAB_0013b2a7:
        uVar10 = *(ulong *)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                            super__Optional_payload_base<gss::innards::SVOBitset>._M_payload;
        if (uVar10 == 0) goto code_r0x0013b2af;
        iVar12 = 0;
        for (; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
          iVar12 = iVar12 + 1;
        }
        uVar13 = iVar12 - (int)lVar20;
      }
LAB_0013b2c8:
      pHVar21 = pHVar8;
      if (uVar13 == 0xffffffff) {
        poVar14 = poVar17 + ppVar29->second;
        uVar16 = (ulong)poVar17[ppVar29->second].
                        super__Optional_base<gss::innards::SVOBitset,_false,_false>._M_payload.
                        super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                        super__Optional_payload_base<gss::innards::SVOBitset>._M_payload._M_value.
                        n_words;
        if (uVar16 < 0x11) {
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x40) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x48) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x50) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x58) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x60) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x68) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x70) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x78) = 0;
          *(undefined8 *)
           &(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload.
            super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
            super__Optional_payload_base<gss::innards::SVOBitset>._M_payload = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 8) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x10) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x18) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x20) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x28) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x30) = 0;
          *(undefined8 *)
           ((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>)._M_payload
                   .super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                   super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 0x38) = 0;
        }
        else {
          memset(*(void **)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>).
                            _M_payload.
                            super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                            super__Optional_payload_base<gss::innards::SVOBitset>._M_payload,0,
                 uVar16 << 3);
        }
        for (; pHVar21 != pHVar9; pHVar21 = pHVar21 + 1) {
          if ((pHVar21->values).n_words < 0x11) {
            pSVar15 = &pHVar21->values;
          }
          else {
            pSVar15 = (SVOBitset *)(pHVar21->values)._data.short_data[0];
          }
          uVar13 = ppVar29->second;
          uVar22 = uVar13 + 0x3f;
          if (-1 < (int)uVar13) {
            uVar22 = uVar13;
          }
          if (((pSVar15->_data).short_data[(int)uVar22 >> 6] >> ((ulong)uVar13 & 0x3f) & 1) != 0) {
            (pSVar15->_data).short_data[(int)uVar22 >> 6] =
                 ~(1L << ((ulong)uVar13 & 0x3f)) & (pSVar15->_data).short_data[(int)uVar22 >> 6];
            puVar1 = &pHVar21->count;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) goto LAB_0013b676;
          }
        }
      }
      else {
        for (; pHVar21 != pHVar9; pHVar21 = pHVar21 + 1) {
          uVar22 = pHVar21->v;
          if (uVar22 < uVar13) {
            pSVar15 = &pHVar21->values;
            uVar3 = (pHVar21->values).n_words;
            pSVar24 = pSVar15;
            if (0x10 < uVar3) {
              pSVar24 = (SVOBitset *)(pHVar21->values)._data.short_data[0];
            }
            uVar23 = ppVar29->second;
            uVar4 = uVar23 + 0x3f;
            if (-1 < (int)uVar23) {
              uVar4 = uVar23;
            }
            if (((pSVar24->_data).short_data[(int)uVar4 >> 6] >> ((ulong)uVar23 & 0x3f) & 1) != 0) {
              if (poVar17[uVar23].super__Optional_base<gss::innards::SVOBitset,_false,_false>.
                  _M_payload.super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                  super__Optional_payload_base<gss::innards::SVOBitset>._M_payload._M_value.n_words
                  < 0x11) {
                poVar14 = poVar17 + uVar23;
              }
              else {
                poVar14 = *(pointer *)
                           &poVar17[uVar23].
                            super__Optional_base<gss::innards::SVOBitset,_false,_false>._M_payload.
                            super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                            super__Optional_payload_base<gss::innards::SVOBitset>._M_payload;
              }
              bVar26 = (byte)uVar22 & 0x3f;
              uVar27 = uVar22 + 0x3f;
              if (-1 < (int)uVar22) {
                uVar27 = uVar22;
              }
              puVar2 = (ulong *)((long)&(poVar14->
                                        super__Optional_base<gss::innards::SVOBitset,_false,_false>)
                                        ._M_payload.
                                        super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>
                                        .super__Optional_payload_base<gss::innards::SVOBitset>.
                                        _M_payload + (long)((int)uVar27 >> 6) * 8);
              *puVar2 = *puVar2 & (-2L << bVar26 | 0xfffffffffffffffeU >> 0x40 - bVar26);
              if (0x10 < uVar3) {
                pSVar15 = (SVOBitset *)(pHVar21->values)._data.short_data[0];
              }
              (pSVar15->_data).short_data[(int)uVar4 >> 6] =
                   (pSVar15->_data).short_data[(int)uVar4 >> 6] & ~(1L << ((ulong)uVar23 & 0x3f));
              puVar1 = &pHVar21->count;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) goto LAB_0013b676;
            }
          }
        }
      }
      ppVar29 = ppVar29 + 1;
    } while (ppVar29 != ppVar5);
  }
  if ((ppVar19 != ppVar5) &&
     ((current_assignment->super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>).
      _M_payload.super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_engaged !=
      false)) {
    uVar13 = (current_assignment->
             super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>)._M_payload.
             super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload._M_value.
             pattern_vertex;
    uVar22 = (current_assignment->
             super__Optional_base<gss::innards::HomomorphismAssignment,_true,_true>)._M_payload.
             super__Optional_payload_base<gss::innards::HomomorphismAssignment>._M_payload._M_value.
             target_vertex;
    pHVar8 = (new_domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pHVar9 = (new_domains->
             super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar26 = 0xd;
      if (ppVar19->second == uVar22) {
        bVar26 = 0xe;
        bVar31 = pHVar8 == pHVar9;
        if (pHVar8 == pHVar9) {
          bVar25 = 0;
          bVar26 = 0xe;
        }
        else {
          bVar25 = 0;
          pHVar21 = pHVar8;
          do {
            uVar3 = pHVar21->v;
            if (uVar3 < uVar13) {
              if ((pHVar21->values).n_words < 0x11) {
                pSVar15 = &pHVar21->values;
              }
              else {
                pSVar15 = (SVOBitset *)(pHVar21->values)._data.short_data[0];
              }
              uVar3 = ppVar19->first;
              uVar23 = uVar3 + 0x3f;
              if (-1 < (int)uVar3) {
                uVar23 = uVar3;
              }
              if (((pSVar15->_data).short_data[(int)uVar23 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) != 0)
              {
                bVar25 = 1;
              }
              bVar30 = true;
            }
            else {
              bVar30 = true;
              if (uVar13 < uVar3) {
                pSVar15 = &pHVar21->values;
                uVar23 = (pHVar21->values).n_words;
                pSVar24 = pSVar15;
                if (0x10 < uVar23) {
                  pSVar24 = (SVOBitset *)(pHVar21->values)._data.short_data[0];
                }
                uVar4 = ppVar19->first;
                uVar27 = uVar4 + 0x3f;
                if (-1 < (int)uVar4) {
                  uVar27 = uVar4;
                }
                if (((pSVar24->_data).short_data[(int)uVar27 >> 6] >> ((ulong)uVar4 & 0x3f) & 1) !=
                    0) {
                  if (local_60.
                      super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar4].
                      super__Optional_base<gss::innards::SVOBitset,_false,_false>._M_payload.
                      super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                      super__Optional_payload_base<gss::innards::SVOBitset>._M_payload._M_value.
                      n_words < 0x11) {
                    poVar17 = local_60.
                              super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar4;
                  }
                  else {
                    poVar17 = *(pointer *)
                               &local_60.
                                super__Vector_base<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                super__Optional_base<gss::innards::SVOBitset,_false,_false>.
                                _M_payload.
                                super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>
                                .super__Optional_payload_base<gss::innards::SVOBitset>._M_payload;
                  }
                  bVar11 = (byte)uVar3 & 0x3f;
                  uVar28 = uVar3 + 0x3f;
                  if (-1 < (int)uVar3) {
                    uVar28 = uVar3;
                  }
                  puVar2 = (ulong *)((long)&(poVar17->
                                            super__Optional_base<gss::innards::SVOBitset,_false,_false>
                                            )._M_payload.
                                            super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>
                                            .super__Optional_payload_base<gss::innards::SVOBitset>.
                                            _M_payload + (long)((int)uVar28 >> 6) * 8);
                  *puVar2 = *puVar2 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
                  if (0x10 < uVar23) {
                    pSVar15 = (SVOBitset *)(pHVar21->values)._data.short_data[0];
                  }
                  (pSVar15->_data).short_data[(int)uVar27 >> 6] =
                       (pSVar15->_data).short_data[(int)uVar27 >> 6] &
                       ~(1L << ((ulong)uVar4 & 0x3f));
                  puVar1 = &pHVar21->count;
                  *puVar1 = *puVar1 - 1;
                  bVar30 = *puVar1 != 0;
                }
              }
            }
            if (!bVar30) {
              bVar26 = 1;
              break;
            }
            pHVar21 = pHVar21 + 1;
            bVar31 = pHVar21 == pHVar9;
          } while (!bVar31);
        }
        if (bVar31) {
          if (pHVar6 != pHVar7) {
            pHVar18 = pHVar6;
            do {
              bVar26 = bVar25;
              if (ppVar19->first == (pHVar18->assignment).target_vertex) {
                bVar26 = 1;
              }
              if (uVar13 <= (pHVar18->assignment).pattern_vertex) {
                bVar26 = bVar25;
              }
              bVar25 = bVar26;
              pHVar18 = pHVar18 + 1;
            } while (pHVar18 != pHVar7);
          }
          bVar26 = ~bVar25 & 1;
        }
      }
      if ((bVar26 != 0xd) && (bVar26 != 0)) goto LAB_0013b676;
      ppVar19 = ppVar19 + 1;
    } while (ppVar19 != ppVar5);
  }
  bVar31 = true;
LAB_0013b678:
  std::
  vector<std::optional<gss::innards::SVOBitset>,_std::allocator<std::optional<gss::innards::SVOBitset>_>_>
  ::~vector(&local_60);
  return bVar31;
code_r0x0013b2af:
  lVar20 = lVar20 + -0x40;
  poVar14 = (pointer)((long)&(poVar14->super__Optional_base<gss::innards::SVOBitset,_false,_false>).
                             _M_payload.
                             super__Optional_payload<gss::innards::SVOBitset,_true,_false,_false>.
                             super__Optional_payload_base<gss::innards::SVOBitset>._M_payload + 8);
  if (uVar16 * 0x40 + lVar20 == 0) goto LAB_0013b2c8;
  goto LAB_0013b2a7;
LAB_0013b676:
  bVar31 = false;
  goto LAB_0013b678;
}

Assistant:

auto HomomorphismSearcher::propagate_occur_less_thans(
    const optional<HomomorphismAssignment> & current_assignment,
    const HomomorphismAssignments & assignments,
    Domains & new_domains) -> bool
{
    vector<optional<SVOBitset>> occurs(model.target_size);

    auto build_occurs = [&](int p) -> void {
        if (occurs[p])
            return;

        occurs[p] = make_optional<SVOBitset>(model.pattern_size, 0);
        for (auto & d : new_domains)
            if (d.values.test(p))
                occurs[p]->set(d.v);
    };

    for (auto & [a, b] : model.target_occur_less_thans_in_convenient_order) {
        build_occurs(a);
        build_occurs(b);
    }

    for (auto & a : assignments.values)
        if (occurs[a.assignment.target_vertex])
            occurs[a.assignment.target_vertex]->set(a.assignment.pattern_vertex);

    // propagate lower bounds
    for (auto & [a, b] : model.target_occur_less_thans_in_convenient_order) {
        auto first_a = occurs[a]->find_first();
        if (first_a == SVOBitset::npos) {
            // no occurrence of value a, value b cannot be used either
            occurs[b]->reset();
            for (auto & d : new_domains)
                if (d.values.test(b)) {
                    d.values.reset(b);
                    if (0 == --d.count)
                        return false;
                }
        }
        else {
            // value a first occurs in variable x, value b cannot be used in a variable lower than x
            for (auto & d : new_domains) {
                if (d.v < first_a && d.values.test(b)) {
                    occurs[b]->reset(d.v);
                    d.values.reset(b);
                    if (0 == --d.count)
                        return false;
                }
            }
        }
    }

    // propagate other way: if value b must occur (because it has been assigned) then
    // value a must go before
    if (current_assignment) {
        for (auto & [a, b] : model.target_occur_less_thans_in_convenient_order) {
            if (b != current_assignment->target_vertex)
                continue;

            bool saw_an_a = false;
            for (auto & d : new_domains) {
                if (d.v < current_assignment->pattern_vertex) {
                    // it's before
                    if (d.values.test(a))
                        saw_an_a = true;
                }
                else if (d.v > current_assignment->pattern_vertex) {
                    // comes after, can't use a
                    if (d.values.test(a)) {
                        occurs[a]->reset(d.v);
                        d.values.reset(a);
                        if (0 == --d.count)
                            return false;
                    }
                }
            }

            for (auto & d : assignments.values)
                if (d.assignment.pattern_vertex < current_assignment->pattern_vertex && a == d.assignment.target_vertex)
                    saw_an_a = true;

            if (! saw_an_a)
                return false;
        }
    }

    return true;
}